

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O1

string * __thiscall
flatbuffers::csharp::CSharpGenerator::Name_abi_cxx11_
          (string *__return_storage_ptr__,CSharpGenerator *this,FieldDef *field)

{
  string name;
  string local_38;
  
  ConvertCase(&local_38,(string *)field,kUpperCamel,kSnake);
  EscapeKeyword(__return_storage_ptr__,this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Name(const FieldDef &field) const {
    std::string name = ConvertCase(field.name, Case::kUpperCamel);
    return EscapeKeyword(name);
  }